

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::from_integer<long,std::__cxx11::string>
          (long value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  long lVar1;
  long lVar2;
  string *s;
  char *pcVar3;
  undefined8 in_RSI;
  long in_RDI;
  size_t count;
  bool is_negative;
  char_type *last;
  char_type *p;
  char_type buf [255];
  assertion_error *this;
  bool local_172;
  bool local_171;
  type_conflict2 local_170;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *local_120;
  char local_118 [255];
  char acStack_19 [9];
  undefined8 local_10;
  long local_8;
  
  local_120 = local_118;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDI < 0) {
    do {
      pcVar3 = local_120 + 1;
      *local_120 = '0' - (char)(local_8 % 10);
      lVar2 = local_8 / 10;
      local_171 = lVar2 != 0 && pcVar3 < acStack_19;
      lVar1 = local_8;
      local_120 = pcVar3;
      local_8 = lVar2;
    } while (local_171);
  }
  else {
    do {
      pcVar3 = local_120 + 1;
      *local_120 = (char)(local_8 % 10) + '0';
      lVar2 = local_8 / 10;
      local_172 = lVar2 != 0 && pcVar3 < acStack_19;
      lVar1 = local_8;
      local_120 = pcVar3;
      local_8 = lVar2;
    } while (local_172);
  }
  if (local_120 == acStack_19) {
    s = (string *)__cxa_allocate_exception(0x10,in_RSI,lVar1 % 10);
    this = (assertion_error *)&stack0xfffffffffffffeaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    assertion_error::assertion_error(this,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  local_170 = (long)local_120 - (long)local_118;
  if (in_RDI < 0) {
    std::__cxx11::string::push_back((char)local_10);
    local_170 = local_170 + 1;
  }
  while (local_120 = local_120 + -1, local_118 <= local_120) {
    std::__cxx11::string::push_back((char)local_10);
  }
  return local_170;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }